

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O3

ktx_error_code_e
ktxTexture_VkUploadEx_WithSuballocator
          (ktxTexture *This,ktxVulkanDeviceInfo *vdi,ktxVulkanTexture *vkTexture,
          VkImageTiling tiling,VkImageUsageFlags usageFlags,VkImageLayout finalLayout,
          ktxVulkanTexture_subAllocatorCallbacks *subAllocatorCallbacks)

{
  VkImage *ppVVar1;
  uint32_t uVar2;
  ktx_bool_t kVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ktx_uint8_t *__src;
  undefined4 uVar7;
  ktxVulkanFunctions vkFuncs;
  ktxVulkanFunctions vkFuncs_00;
  VkBufferImageCopy *__ptr;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ktx_bool_t kVar10;
  uint32_t i_1;
  ktx_uint32_t kVar11;
  VkImageViewType VVar12;
  class_id cVar13;
  VkResult VVar14;
  ktx_uint32_t kVar15;
  ktx_error_code_e kVar16;
  uint uVar17;
  uint64_t uVar18;
  void *pvVar19;
  PFN_vkWaitForFences p_Var20;
  VkImageType VVar21;
  VkFormatProperties *pVVar22;
  code *iterCb;
  uint uVar23;
  VkImageCreateFlags VVar25;
  uint32_t i_2;
  uint32_t uVar26;
  ktxVulkanTexture *pkVar27;
  uint32_t i;
  long lVar28;
  VkFilter blitFilter;
  VkImageUsageFlags VVar29;
  bool bVar30;
  double dVar31;
  VkDeviceMemory stagingMemory;
  VkBuffer stagingBuffer;
  VkMemoryAllocateInfo memAllocInfo;
  VkImageSubresourceRange subresourceRange_1;
  VkMemoryRequirements memReqs;
  VkDeviceMemory mappableMemory;
  VkImage mappableImage;
  ktx_uint8_t *pMappedStagingBuffer;
  uint64_t numPages;
  VkSubmitInfo submitInfo;
  VkFence copyFence;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  VkImageFormatProperties imageFormatProperties;
  VkFormatProperties formatProperties;
  undefined4 in_stack_fffffffffffffc7c;
  undefined8 in_stack_fffffffffffffc80;
  VkImageMemoryBarrier *pVVar32;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 uVar33;
  uint32_t uVar34;
  ktxVulkanDeviceInfo *in_stack_fffffffffffffc90;
  ktxVulkanDeviceInfo *pkVar35;
  ktxVulkanDeviceInfo *pkVar36;
  undefined4 uVar37;
  ktxVulkanFunctions *__src_00;
  undefined4 uVar38;
  VkCommandBuffer *ppVVar39;
  ktxVulkanTexture *pkVar40;
  VkDeviceMemory in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  VkBuffer in_stack_fffffffffffffcd0;
  undefined8 uVar41;
  void *pvVar42;
  ulong uVar43;
  undefined4 uVar44;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined8 in_stack_fffffffffffffd08;
  undefined8 uVar45;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 uVar46;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  ulong in_stack_fffffffffffffd20;
  ulong uVar47;
  VkDeviceSize in_stack_fffffffffffffd28;
  uint in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  VkDeviceMemory pVVar48;
  VkDeviceMemory pVVar49;
  void *in_stack_fffffffffffffd40;
  void *pvVar50;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 uVar51;
  PFN_vkWaitForFences in_stack_fffffffffffffd50;
  VkImage in_stack_fffffffffffffd58;
  VkImage pVVar52;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 uVar53;
  uint32_t in_stack_fffffffffffffd68;
  ktx_uint8_t *local_280;
  VkBufferCreateInfo local_278;
  VkSubmitInfo local_238;
  VkFence local_1f0;
  VkImageCreateInfo local_1e8;
  VkCommandBufferBeginInfo local_188;
  VkImageFormatProperties local_168;
  undefined1 local_148 [4];
  undefined1 auStack_144 [12];
  undefined1 local_138 [12];
  undefined4 uStack_12c;
  undefined8 local_128;
  VkImage pVStack_120;
  undefined1 local_118 [200];
  VkDevice local_50;
  void *local_48;
  ktxTexture *local_40;
  ulong uVar24;
  
  local_188.flags = 0;
  local_188._20_4_ = 0;
  local_188.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  local_188.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  local_188._4_4_ = 0;
  local_188.pNext = (void *)0x0;
  local_1e8.pNext = (void *)0x0;
  local_1e8.queueFamilyIndexCount = 0;
  local_1e8._68_4_ = 0;
  local_1e8.pQueueFamilyIndices = (uint32_t *)0x0;
  local_1e8.samples = 0;
  local_1e8.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_1e8.usage = 0;
  local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_1e8.extent.height = 0;
  local_1e8.extent.depth = 0;
  local_1e8.mipLevels = 0;
  local_1e8.arrayLayers = 0;
  local_1e8.flags = 0;
  local_1e8.imageType = VK_IMAGE_TYPE_1D;
  local_1e8.format = VK_FORMAT_UNDEFINED;
  local_1e8.extent.width = 0;
  local_1e8._80_8_ = 0;
  local_1e8.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_1e8._4_4_ = 0;
  uVar44 = 0;
  uVar41._0_4_ = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  uVar41._4_4_ = 0;
  pvVar42 = (void *)0x0;
  kVar11 = ktxTexture_GetElementSize(This);
  if (subAllocatorCallbacks != (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    if (subAllocatorCallbacks->allocMemFuncPtr == (ktxVulkanTexture_subAllocatorAllocMemFuncPtr)0x0)
    {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->bindBufferFuncPtr ==
        (ktxVulkanTexture_subAllocatorBindBufferFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->bindImageFuncPtr ==
        (ktxVulkanTexture_subAllocatorBindImageFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->memoryMapFuncPtr ==
        (ktxVulkanTexture_subAllocatorMemoryMapFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->memoryUnmapFuncPtr ==
        (ktxVulkanTexture_subAllocatorMemoryUnmapFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->freeMemFuncPtr == (ktxVulkanTexture_subAllocatorFreeMemFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
  }
  if (vkTexture == (ktxVulkanTexture *)0x0 ||
      (This == (ktxTexture *)0x0 || vdi == (ktxVulkanDeviceInfo *)0x0)) {
    return KTX_INVALID_VALUE;
  }
  if ((This->pData == (ktx_uint8_t *)0x0) && (kVar10 = ktxTexture_isActiveStream(This), !kVar10)) {
    return KTX_INVALID_OPERATION;
  }
  kVar15 = This->numDimensions;
  if ((This->numFaces == 6) && (bVar30 = kVar15 != 2, kVar15 = 2, bVar30)) {
    __assert_fail("This->numFaces == 6 ? This->numDimensions == 2 : VK_TRUE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                  ,0x366,
                  "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                 );
  }
  kVar10 = This->isCubemap;
  uVar26 = This->numLayers * 6;
  if (kVar10 == false) {
    uVar26 = This->numLayers;
  }
  if (2 < kVar15 - 1) {
    __assert_fail("This->numDimensions >= 1 && This->numDimensions <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                  ,0x36e,
                  "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                 );
  }
  kVar3 = This->isArray;
  if (kVar15 == 3) {
    VVar12 = VK_IMAGE_VIEW_TYPE_3D;
    VVar21 = VK_IMAGE_TYPE_3D;
    if (kVar3 != false) {
      __assert_fail("!This->isArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,900,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
  }
  else if (kVar15 == 1) {
    VVar12 = (uint)kVar3 << 2;
    VVar21 = VK_IMAGE_TYPE_1D;
  }
  else {
    if (kVar10 == false) {
      VVar12 = (uint)kVar3 * 4 + VK_IMAGE_VIEW_TYPE_2D;
    }
    else {
      VVar12 = (uint)kVar3 + (uint)kVar3 * 2 + VK_IMAGE_VIEW_TYPE_CUBE;
    }
    VVar21 = VK_IMAGE_TYPE_2D;
  }
  if (This->classId == ktxTexture2_c) {
    cVar13 = This[1].classId;
  }
  else {
    cVar13 = ktxTexture1_GetVkFormat((ktxTexture1 *)This);
  }
  if (cVar13 == 0) {
    return KTX_INVALID_OPERATION;
  }
  VVar25 = (uint)kVar10 << 4;
  uVar23 = usageFlags | 2;
  if (tiling != VK_IMAGE_TILING_OPTIMAL) {
    uVar23 = usageFlags;
  }
  VVar29 = uVar23 | 3;
  if (This->generateMipmaps == false) {
    VVar29 = uVar23;
  }
  VVar14 = (*(vdi->vkFuncs).vkGetPhysicalDeviceImageFormatProperties)
                     (vdi->physicalDevice,cVar13,VVar21,tiling,VVar29,VVar25,&local_168);
  if (VVar14 == VK_ERROR_FORMAT_NOT_SUPPORTED) {
    return KTX_INVALID_OPERATION;
  }
  if (local_168.maxArrayLayers < This->numLayers) {
    return KTX_INVALID_OPERATION;
  }
  if (This->generateMipmaps == true) {
    (*(vdi->vkFuncs).vkGetPhysicalDeviceFormatProperties)
              (vdi->physicalDevice,cVar13,(VkFormatProperties *)local_148);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("vResult == VK_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x3ae,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
    pVVar22 = (VkFormatProperties *)local_148;
    if (tiling == VK_IMAGE_TILING_OPTIMAL) {
      pVVar22 = (VkFormatProperties *)(local_148 + 4);
    }
    if ((~pVVar22->linearTilingFeatures & 0xc00) != 0) {
      return KTX_INVALID_OPERATION;
    }
    blitFilter = pVVar22->linearTilingFeatures >> 0xc & VK_FILTER_LINEAR;
    uVar23 = This->baseHeight;
    if (This->baseHeight < This->baseWidth) {
      uVar23 = This->baseWidth;
    }
    if (uVar23 <= This->baseDepth) {
      uVar23 = This->baseDepth;
    }
    dVar31 = log2((double)uVar23);
    dVar31 = floor(dVar31);
    uVar23 = (int)(long)dVar31 + 1;
    in_stack_fffffffffffffc90 = vdi;
  }
  else {
    uVar23 = This->numLevels;
    blitFilter = VK_FILTER_LINEAR;
  }
  uVar24 = (ulong)uVar23;
  if (local_168.maxMipLevels < uVar23) {
    return KTX_INVALID_OPERATION;
  }
  bVar30 = true;
  if ((This->classId != ktxTexture2_c) &&
     (kVar15 = ktxTexture_GetRowPitch(This,0), (kVar11 & 3) != 0)) {
    bVar30 = kVar15 == This->baseWidth * kVar11 && This->numLevels == 1;
  }
  kVar15 = This->baseHeight;
  vkTexture->width = This->baseWidth;
  vkTexture->height = kVar15;
  vkTexture->depth = This->baseDepth;
  vkTexture->imageLayout = finalLayout;
  vkTexture->imageFormat = cVar13;
  vkTexture->levelCount = uVar23;
  vkTexture->layerCount = uVar26;
  vkTexture->viewType = VVar12;
  vkTexture->vkDestroyImage = (vdi->vkFuncs).vkDestroyImage;
  vkTexture->vkFreeMemory = (vdi->vkFuncs).vkFreeMemory;
  ppVVar39 = &vdi->cmdBuffer;
  pkVar40 = vkTexture;
  (*(vdi->vkFuncs).vkBeginCommandBuffer)(vdi->cmdBuffer,&local_188);
  uVar33 = CONCAT13(bVar30,(int3)in_stack_fffffffffffffc88);
  if (tiling != VK_IMAGE_TILING_OPTIMAL) {
    __src_00 = &vdi->vkFuncs;
    lVar28 = 0;
    pVVar48 = (VkDeviceMemory)0x0;
    local_238.pNext = (void *)0x0;
    local_238.pSignalSemaphores = (VkSemaphore *)0x0;
    local_238.pCommandBuffers = (VkCommandBuffer *)0x0;
    local_238.signalSemaphoreCount = 0;
    local_238._60_4_ = 0;
    local_238.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    local_238.commandBufferCount = 0;
    local_238._44_4_ = 0;
    local_238._16_8_ = 0;
    local_238.pWaitSemaphores = (VkSemaphore *)0x0;
    local_238.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    local_238._4_4_ = 0;
    local_1e8.imageType = VVar21;
    local_1e8.flags = VVar25;
    uVar4 = vkTexture->width;
    uVar6 = vkTexture->height;
    local_1e8.extent.depth = vkTexture->depth;
    local_1e8.arrayLayers = uVar26;
    local_1e8.mipLevels = (uint32_t)uVar24;
    local_1e8.samples = VK_SAMPLE_COUNT_1_BIT;
    local_1e8.tiling = VK_IMAGE_TILING_LINEAR;
    local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    local_1e8.usage = VVar29;
    local_1e8.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;
    local_1e8.format = cVar13;
    local_1e8.extent.width = uVar4;
    local_1e8.extent.height = uVar6;
    (*(vdi->vkFuncs).vkCreateImage)
              (vdi->device,&local_1e8,vdi->pAllocator,(VkImage *)&stack0xfffffffffffffd58);
    (*(vdi->vkFuncs).vkGetImageMemoryRequirements)
              (vdi->device,in_stack_fffffffffffffd58,
               (VkMemoryRequirements *)&stack0xfffffffffffffd20);
    uVar23 = in_stack_fffffffffffffd30;
    do {
      if (((uVar23 & 1) != 0) &&
         ((~(vdi->deviceMemoryProperties).memoryTypes[lVar28].propertyFlags & 6) == 0))
      goto LAB_001dec80;
      uVar23 = uVar23 >> 1;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0x20);
    lVar28 = 0;
LAB_001dec80:
    uVar2 = (uint32_t)lVar28;
    pkVar27 = pkVar40;
    uVar43 = in_stack_fffffffffffffd20;
    if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
      VVar14 = (*(vdi->vkFuncs).vkAllocateMemory)
                         (vdi->device,(VkMemoryAllocateInfo *)&stack0xfffffffffffffcd8,
                          vdi->pAllocator,(VkDeviceMemory *)&stack0xfffffffffffffd38);
      if (VVar14 != VK_SUCCESS) {
        return KTX_OUT_OF_MEMORY;
      }
      (*(vdi->vkFuncs).vkBindImageMemory)(vdi->device,in_stack_fffffffffffffd58,pVVar48,0);
    }
    else {
      local_278._0_8_ = 0;
      uVar18 = (*subAllocatorCallbacks->allocMemFuncPtr)
                         ((VkMemoryAllocateInfo *)&stack0xfffffffffffffcd8,
                          (VkMemoryRequirements *)&stack0xfffffffffffffd20,(uint64_t *)&local_278);
      pkVar40->allocationId = uVar18;
      if (uVar18 == 0) {
        return KTX_OUT_OF_MEMORY;
      }
      if (1 < (ulong)local_278._0_8_) {
        return KTX_UNSUPPORTED_FEATURE;
      }
      (*subAllocatorCallbacks->bindImageFuncPtr)(in_stack_fffffffffffffd58,uVar18);
    }
    memcpy(local_148,__src_00,0xf0);
    if ((char)((uint)uVar33 >> 0x18) == '\0') {
      iterCb = linearTilingPadCallback;
    }
    else {
      iterCb = linearTilingCallback;
    }
    local_50 = vdi->device;
    local_40 = This;
    if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
      (*(vdi->vkFuncs).vkMapMemory)(local_50,pVVar48,0,uVar43,0,&local_48);
    }
    else {
      (*subAllocatorCallbacks->memoryMapFuncPtr)
                (pkVar40->allocationId,0,(VkDeviceSize *)&stack0xfffffffffffffd20,&local_48);
    }
    kVar10 = ktxTexture_isActiveStream(This);
    if (kVar10) {
      (*This->vtbl->IterateLoadLevelFaces)(This,iterCb,local_148);
    }
    else {
      ktxTexture_IterateLevelFaces(This,iterCb,local_148);
    }
    if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
      (*(vdi->vkFuncs).vkUnmapMemory)(vdi->device,pVVar48);
      pkVar40->deviceMemory = pVVar48;
    }
    else {
      (*subAllocatorCallbacks->memoryUnmapFuncPtr)(pkVar40->allocationId,0);
    }
    pkVar40->image = in_stack_fffffffffffffd58;
    if (This->generateMipmaps == true) {
      generateMipmaps(pkVar40,vdi,blitFilter,VK_IMAGE_LAYOUT_PREINITIALIZED);
    }
    else {
      local_278._0_8_ = 1;
      local_278.pNext = (void *)(uVar24 & 0xffffffff);
      local_278.flags = uVar26;
      vkFuncs.vkGetDeviceProcAddr._0_4_ = (int)uVar24;
      vkFuncs.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)0x1;
      vkFuncs.vkGetDeviceProcAddr._4_4_ = 0;
      vkFuncs.vkAllocateCommandBuffers._0_4_ = uVar26;
      vkFuncs.vkAllocateCommandBuffers._4_4_ = in_stack_fffffffffffffc7c;
      vkFuncs.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffc80;
      vkFuncs.vkBeginCommandBuffer._0_4_ = uVar33;
      vkFuncs.vkBeginCommandBuffer._4_4_ = uVar26;
      vkFuncs.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffc90;
      vkFuncs.vkBindImageMemory._0_4_ = (int)__src_00;
      vkFuncs.vkBindImageMemory._4_4_ = (int)((ulong)__src_00 >> 0x20);
      vkFuncs.vkCmdBlitImage._0_4_ = VVar29;
      vkFuncs.vkCmdBlitImage._4_4_ = finalLayout;
      vkFuncs.vkCmdCopyBufferToImage._0_4_ = (int)ppVVar39;
      vkFuncs.vkCmdCopyBufferToImage._4_4_ = (int)((ulong)ppVVar39 >> 0x20);
      vkFuncs.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)pkVar27;
      vkFuncs.vkCreateImage = (PFN_vkCreateImage)in_stack_fffffffffffffcb8;
      vkFuncs.vkDestroyImage._0_4_ = in_stack_fffffffffffffcc0;
      vkFuncs.vkDestroyImage._4_4_ = blitFilter;
      vkFuncs.vkCreateBuffer._0_4_ = VVar21;
      vkFuncs.vkCreateBuffer._4_4_ = VVar25;
      vkFuncs.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffcd0;
      vkFuncs.vkCreateFence = (PFN_vkCreateFence)uVar41;
      vkFuncs.vkDestroyFence = (PFN_vkDestroyFence)pvVar42;
      vkFuncs.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffd20;
      vkFuncs.vkFreeCommandBuffers._0_4_ = uVar2;
      vkFuncs.vkFreeCommandBuffers._4_4_ = uVar44;
      vkFuncs.vkFreeMemory = (PFN_vkFreeMemory)uVar24;
      vkFuncs.vkGetBufferMemoryRequirements._0_4_ = in_stack_fffffffffffffd00;
      vkFuncs.vkGetBufferMemoryRequirements._4_4_ = in_stack_fffffffffffffd04;
      vkFuncs.vkGetImageMemoryRequirements =
           (PFN_vkGetImageMemoryRequirements)in_stack_fffffffffffffd08;
      vkFuncs.vkGetImageSubresourceLayout._0_4_ = in_stack_fffffffffffffd10;
      vkFuncs.vkGetImageSubresourceLayout._4_4_ = in_stack_fffffffffffffd14;
      vkFuncs.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_fffffffffffffd18;
      vkFuncs.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_fffffffffffffd1c;
      vkFuncs.vkGetPhysicalDeviceFormatProperties = (PFN_vkGetPhysicalDeviceFormatProperties)uVar43;
      vkFuncs.vkGetPhysicalDeviceMemoryProperties =
           (PFN_vkGetPhysicalDeviceMemoryProperties)in_stack_fffffffffffffd28;
      vkFuncs.vkMapMemory._0_4_ = in_stack_fffffffffffffd30;
      vkFuncs.vkMapMemory._4_4_ = in_stack_fffffffffffffd34;
      vkFuncs.vkQueueSubmit = (PFN_vkQueueSubmit)pVVar48;
      vkFuncs.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffd40;
      vkFuncs.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffd48;
      vkFuncs.vkWaitForFences = in_stack_fffffffffffffd50;
      subresourceRange.levelCount = (int)in_stack_fffffffffffffd60;
      subresourceRange.baseArrayLayer = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
      subresourceRange._0_8_ = in_stack_fffffffffffffd58;
      subresourceRange.layerCount = in_stack_fffffffffffffd68;
      setImageLayout(vkFuncs,(VkCommandBuffer)(vdi->vkFuncs).vkCmdPipelineBarrier,
                     (VkImage)vdi->cmdBuffer,(VkImageLayout)in_stack_fffffffffffffd58,
                     VK_IMAGE_LAYOUT_PREINITIALIZED,subresourceRange);
    }
    (*(vdi->vkFuncs).vkEndCommandBuffer)(vdi->cmdBuffer);
    local_238._16_8_ = local_238._16_8_ & 0xffffffff00000000;
    local_238.commandBufferCount = 1;
    local_238.pCommandBuffers = ppVVar39;
    (*(vdi->vkFuncs).vkQueueSubmit)(vdi->queue,1,&local_238,(VkFence)0x0);
    (*(vdi->vkFuncs).vkQueueWaitIdle)(vdi->queue);
    return KTX_SUCCESS;
  }
  pVVar48 = (VkDeviceMemory)0x0;
  local_278.pNext = (void *)0x0;
  local_278.pQueueFamilyIndices = (uint32_t *)0x0;
  local_278.usage = 0;
  local_278.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_278.queueFamilyIndexCount = 0;
  local_278._44_4_ = 0;
  local_278.flags = 0;
  local_278._20_4_ = 0;
  local_278.size = 0;
  local_278.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_278._4_4_ = 0;
  uVar51._0_4_ = 0;
  uVar51._4_4_ = 0;
  pVVar49 = (VkDeviceMemory)0x8;
  pvVar50 = (void *)0x0;
  local_238.pNext = (void *)0x0;
  local_238.pSignalSemaphores = (VkSemaphore *)0x0;
  local_238.pCommandBuffers = (VkCommandBuffer *)0x0;
  local_238.signalSemaphoreCount = 0;
  local_238._60_4_ = 0;
  local_238.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  local_238.commandBufferCount = 0;
  local_238._44_4_ = 0;
  local_238.waitSemaphoreCount = 0;
  local_238._20_4_ = 0;
  local_238.pWaitSemaphores = (VkSemaphore *)0x0;
  local_238.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  local_238._4_4_ = 0;
  local_278.size = (*This->vtbl->GetDataSizeUncompressed)(This);
  if (bVar30 == false) {
    kVar15 = This->numLevels;
    if (This->isArray == false) {
      kVar15 = kVar15 * This->numFaces;
    }
    local_278.size = local_278.size + kVar11 * kVar15 * 4;
  }
  else {
    kVar15 = This->numLevels;
  }
  pvVar19 = malloc((ulong)kVar15 * 0x38);
  kVar16 = KTX_OUT_OF_MEMORY;
  uVar37 = SUB84(pvVar19,0);
  uVar38 = (undefined4)((ulong)pvVar19 >> 0x20);
  if (pvVar19 == (void *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  local_278.usage = 1;
  local_278.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  (*(vdi->vkFuncs).vkCreateBuffer)
            (vdi->device,&local_278,vdi->pAllocator,(VkBuffer *)&stack0xfffffffffffffcd0);
  (*(vdi->vkFuncs).vkGetBufferMemoryRequirements)
            (vdi->device,in_stack_fffffffffffffcd0,(VkMemoryRequirements *)&stack0xfffffffffffffd20)
  ;
  lVar28 = 0;
  uVar23 = in_stack_fffffffffffffd30;
  do {
    if (((uVar23 & 1) != 0) &&
       ((~(vdi->deviceMemoryProperties).memoryTypes[lVar28].propertyFlags & 6) == 0)) break;
    uVar23 = uVar23 >> 1;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x20);
  pkVar35 = vdi;
  uVar43 = in_stack_fffffffffffffd20;
  if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    VVar14 = (*(vdi->vkFuncs).vkAllocateMemory)
                       (vdi->device,(VkMemoryAllocateInfo *)&stack0xfffffffffffffcd8,vdi->pAllocator
                        ,(VkDeviceMemory *)&stack0xfffffffffffffcb8);
    if (VVar14 == VK_SUCCESS) {
      p_Var20 = (PFN_vkWaitForFences)0x0;
      (*(vdi->vkFuncs).vkBindBufferMemory)(vdi->device,in_stack_fffffffffffffcd0,pVVar48,0);
      (*(vdi->vkFuncs).vkMapMemory)(vdi->device,pVVar48,0,uVar43,0,&local_280);
LAB_001df020:
      uVar53 = 0;
      pVVar52 = (VkImage)CONCAT44(uVar38,uVar37);
      uVar2 = This->numFaces;
      __src = This->pData;
      if ((char)((uint)uVar33 >> 0x18) == '\0') {
        uVar34 = uVar26;
        uVar23 = VVar29;
        if (__src == (ktx_uint8_t *)0x0) {
          (*This->vtbl->IterateLoadLevelFaces)
                    (This,optimalTilingPadCallback,&stack0xfffffffffffffd58);
        }
        else {
          ktxTexture_IterateLevelFaces(This,optimalTilingPadCallback,&stack0xfffffffffffffd58);
        }
      }
      else {
        if (__src == (ktx_uint8_t *)0x0) {
          kVar16 = (*This->vtbl->LoadImageData)(This,local_280,in_stack_fffffffffffffd20);
          if (kVar16 != KTX_SUCCESS) {
            return kVar16;
          }
        }
        else {
          if (in_stack_fffffffffffffd20 < This->dataSize) {
            __assert_fail("This->dataSize <= memAllocInfo.allocationSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                          ,0x474,
                          "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                         );
          }
          memcpy(local_280,__src,This->dataSize);
        }
        (*This->vtbl->IterateLevels)(This,optimalTilingCallback,&stack0xfffffffffffffd58);
        uVar34 = uVar26;
        uVar23 = VVar29;
      }
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        (*(vdi->vkFuncs).vkUnmapMemory)(vdi->device,pVVar48);
      }
      else {
        (*subAllocatorCallbacks->memoryUnmapFuncPtr)((uint64_t)p_Var20,0);
      }
      local_1e8.imageType = VVar21;
      local_1e8.flags = VVar25;
      local_1e8.arrayLayers = uVar26;
      local_1e8.mipLevels = (uint32_t)uVar24;
      local_1e8.samples = VK_SAMPLE_COUNT_1_BIT;
      local_1e8.tiling = VK_IMAGE_TILING_OPTIMAL;
      lVar28 = 0;
      local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      local_1e8.usage = VVar29;
      local_1e8._80_8_ = local_1e8._80_8_ & 0xffffffff00000000;
      uVar5 = pkVar40->width;
      uVar7 = pkVar40->height;
      local_1e8.extent.depth = pkVar40->depth;
      ppVVar1 = &pkVar40->image;
      pkVar27 = pkVar40;
      local_1e8.format = cVar13;
      local_1e8.extent.width = uVar5;
      local_1e8.extent.height = uVar7;
      (*(vdi->vkFuncs).vkCreateImage)(vdi->device,&local_1e8,vdi->pAllocator,ppVVar1);
      (*(vdi->vkFuncs).vkGetImageMemoryRequirements)
                (vdi->device,pkVar40->image,(VkMemoryRequirements *)&stack0xfffffffffffffd20);
      uVar17 = in_stack_fffffffffffffd30;
      do {
        if (((uVar17 & 1) != 0) &&
           (((pkVar35->deviceMemoryProperties).memoryTypes[lVar28].propertyFlags & 1) != 0))
        goto LAB_001df3a0;
        uVar17 = uVar17 >> 1;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 0x20);
      lVar28 = 0;
LAB_001df3a0:
      uVar26 = (uint32_t)lVar28;
      pkVar36 = pkVar35;
      uVar47 = uVar43;
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        pkVar40 = pkVar27;
        (*(pkVar35->vkFuncs).vkAllocateMemory)
                  (pkVar35->device,(VkMemoryAllocateInfo *)&stack0xfffffffffffffcd8,
                   pkVar35->pAllocator,&pkVar27->deviceMemory);
        (*(pkVar35->vkFuncs).vkBindImageMemory)
                  (pkVar35->device,pkVar27->image,pkVar27->deviceMemory,0);
      }
      else {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auStack_144._4_8_;
        _local_148 = auVar9 << 0x40;
        uVar18 = (*subAllocatorCallbacks->allocMemFuncPtr)
                           ((VkMemoryAllocateInfo *)&stack0xfffffffffffffcd8,
                            (VkMemoryRequirements *)&stack0xfffffffffffffd20,(uint64_t *)local_148);
        pkVar27->allocationId = uVar18;
        if (uVar18 == 0) {
          return KTX_OUT_OF_MEMORY;
        }
        if (1 < _local_148) {
          return KTX_UNSUPPORTED_FEATURE;
        }
        pkVar40 = pkVar27;
        (*subAllocatorCallbacks->bindImageFuncPtr)(*ppVVar1,uVar18);
      }
      uVar45 = 1;
      kVar11 = This->numLevels;
      uVar46 = 0;
      pVVar32 = (VkImageMemoryBarrier *)local_148;
      auStack_144 = SUB1612((undefined1  [16])0x0,4);
      local_148 = (undefined1  [4])0x2d;
      local_138 = SUB1612((undefined1  [16])0x0,0);
      uStack_12c = 7;
      pVStack_120 = *ppVVar1;
      local_128 = 0xffffffffffffffff;
      local_118._0_4_ = 1;
      local_118._4_4_ = 0;
      local_118._12_4_ = 0;
      local_118._20_4_ = 0;
      local_118._16_4_ = uVar34;
      local_138._0_8_ = 0x100000000000;
      uVar17 = uVar34;
      local_118._8_4_ = kVar11;
      (*(pkVar35->vkFuncs).vkCmdPipelineBarrier)
                (pkVar35->cmdBuffer,0x10000,0x10000,0,0,(VkMemoryBarrier *)0x0,0,
                 (VkBufferMemoryBarrier *)0x0,1,pVVar32);
      __ptr = (VkBufferImageCopy *)CONCAT44(uVar38,uVar37);
      (*(pkVar35->vkFuncs).vkCmdCopyBufferToImage)
                (pkVar35->cmdBuffer,in_stack_fffffffffffffcd0,*ppVVar1,
                 VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,kVar15,__ptr);
      free(__ptr);
      if (This->generateMipmaps == true) {
        generateMipmaps(pkVar27,pkVar35,blitFilter,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
      }
      else {
        vkFuncs_00.vkGetDeviceProcAddr._4_4_ = uVar46;
        vkFuncs_00.vkGetDeviceProcAddr._0_4_ = kVar11;
        vkFuncs_00.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)uVar45;
        vkFuncs_00.vkAllocateCommandBuffers._0_4_ = uVar17;
        vkFuncs_00.vkAllocateCommandBuffers._4_4_ = in_stack_fffffffffffffc7c;
        vkFuncs_00.vkAllocateMemory = (PFN_vkAllocateMemory)pVVar32;
        vkFuncs_00.vkBeginCommandBuffer._0_4_ = uVar33;
        vkFuncs_00.vkBeginCommandBuffer._4_4_ = uVar34;
        vkFuncs_00.vkBindBufferMemory = (PFN_vkBindBufferMemory)pkVar36;
        vkFuncs_00.vkBindImageMemory._0_4_ = uVar37;
        vkFuncs_00.vkBindImageMemory._4_4_ = uVar38;
        vkFuncs_00.vkCmdBlitImage._0_4_ = uVar23;
        vkFuncs_00.vkCmdBlitImage._4_4_ = finalLayout;
        vkFuncs_00.vkCmdCopyBufferToImage._0_4_ = (int)ppVVar39;
        vkFuncs_00.vkCmdCopyBufferToImage._4_4_ = (int)((ulong)ppVVar39 >> 0x20);
        vkFuncs_00.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)pkVar40;
        vkFuncs_00.vkCreateImage = (PFN_vkCreateImage)pVVar48;
        vkFuncs_00.vkDestroyImage._0_4_ = in_stack_fffffffffffffcc0;
        vkFuncs_00.vkDestroyImage._4_4_ = blitFilter;
        vkFuncs_00.vkCreateBuffer._0_4_ = VVar21;
        vkFuncs_00.vkCreateBuffer._4_4_ = VVar25;
        vkFuncs_00.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffcd0;
        vkFuncs_00.vkCreateFence = (PFN_vkCreateFence)uVar41;
        vkFuncs_00.vkDestroyFence = (PFN_vkDestroyFence)pvVar42;
        vkFuncs_00.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)uVar43;
        vkFuncs_00.vkFreeCommandBuffers._0_4_ = uVar26;
        vkFuncs_00.vkFreeCommandBuffers._4_4_ = uVar44;
        vkFuncs_00.vkFreeMemory = (PFN_vkFreeMemory)uVar24;
        vkFuncs_00.vkGetBufferMemoryRequirements._0_4_ = in_stack_fffffffffffffd00;
        vkFuncs_00.vkGetBufferMemoryRequirements._4_4_ = kVar15;
        vkFuncs_00.vkGetImageMemoryRequirements = (PFN_vkGetImageMemoryRequirements)uVar45;
        vkFuncs_00.vkGetImageSubresourceLayout._0_4_ = kVar11;
        vkFuncs_00.vkGetImageSubresourceLayout._4_4_ = uVar46;
        vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties._0_4_ = uVar17;
        vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_fffffffffffffd1c;
        vkFuncs_00.vkGetPhysicalDeviceFormatProperties =
             (PFN_vkGetPhysicalDeviceFormatProperties)uVar47;
        vkFuncs_00.vkGetPhysicalDeviceMemoryProperties =
             (PFN_vkGetPhysicalDeviceMemoryProperties)in_stack_fffffffffffffd28;
        vkFuncs_00.vkMapMemory._0_4_ = in_stack_fffffffffffffd30;
        vkFuncs_00.vkMapMemory._4_4_ = in_stack_fffffffffffffd34;
        vkFuncs_00.vkQueueSubmit = (PFN_vkQueueSubmit)pVVar49;
        vkFuncs_00.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)pvVar50;
        vkFuncs_00.vkUnmapMemory = (PFN_vkUnmapMemory)uVar51;
        vkFuncs_00.vkWaitForFences = p_Var20;
        subresourceRange_00.levelCount = (int)uVar53;
        subresourceRange_00.baseArrayLayer = (int)((ulong)uVar53 >> 0x20);
        subresourceRange_00._0_8_ = pVVar52;
        subresourceRange_00.layerCount = uVar2;
        setImageLayout(vkFuncs_00,(VkCommandBuffer)(pkVar35->vkFuncs).vkCmdPipelineBarrier,
                       (VkImage)pkVar35->cmdBuffer,(VkImageLayout)*ppVVar1,
                       VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,subresourceRange_00);
      }
      (*(pkVar35->vkFuncs).vkEndCommandBuffer)(pkVar35->cmdBuffer);
      (*(pkVar36->vkFuncs).vkCreateFence)
                (pkVar35->device,(VkFenceCreateInfo *)&stack0xfffffffffffffd38,pkVar35->pAllocator,
                 &local_1f0);
      local_238.commandBufferCount = 1;
      local_238.pCommandBuffers = ppVVar39;
      (*(pkVar36->vkFuncs).vkQueueSubmit)(pkVar36->queue,1,&local_238,local_1f0);
      (*(pkVar36->vkFuncs).vkWaitForFences)(pkVar36->device,1,&local_1f0,1,100000000000);
      (*(pkVar36->vkFuncs).vkDestroyFence)(pkVar36->device,local_1f0,pkVar36->pAllocator);
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        (*(pkVar36->vkFuncs).vkFreeMemory)(pkVar36->device,pVVar48,pkVar36->pAllocator);
      }
      else {
        (*subAllocatorCallbacks->freeMemFuncPtr)((uint64_t)p_Var20);
      }
      (*(pkVar36->vkFuncs).vkDestroyBuffer)
                (pkVar36->device,in_stack_fffffffffffffcd0,pkVar36->pAllocator);
      return KTX_SUCCESS;
    }
  }
  else {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = auStack_144._4_8_;
    _local_148 = auVar8 << 0x40;
    p_Var20 = (PFN_vkWaitForFences)
              (*subAllocatorCallbacks->allocMemFuncPtr)
                        ((VkMemoryAllocateInfo *)&stack0xfffffffffffffcd8,
                         (VkMemoryRequirements *)&stack0xfffffffffffffd20,(uint64_t *)local_148);
    if (p_Var20 == (PFN_vkWaitForFences)0x0) {
      kVar16 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar16 = KTX_UNSUPPORTED_FEATURE;
      if (_local_148 < 2) {
        (*subAllocatorCallbacks->bindBufferFuncPtr)(in_stack_fffffffffffffcd0,(uint64_t)p_Var20);
        (*subAllocatorCallbacks->memoryMapFuncPtr)
                  ((uint64_t)p_Var20,0,(VkDeviceSize *)&stack0xfffffffffffffd20,&local_280);
        goto LAB_001df020;
      }
    }
  }
  free((void *)CONCAT44(uVar38,uVar37));
  return kVar16;
}

Assistant:

KTX_error_code
ktxTexture_VkUploadEx_WithSuballocator(ktxTexture* This, ktxVulkanDeviceInfo* vdi,
                                       ktxVulkanTexture* vkTexture,
                                       VkImageTiling tiling,
                                       VkImageUsageFlags usageFlags,
                                       VkImageLayout finalLayout,
                                       ktxVulkanTexture_subAllocatorCallbacks* subAllocatorCallbacks)
{
    KTX_error_code           kResult;
    VkFilter                 blitFilter = VK_FILTER_LINEAR;
    VkFormat                 vkFormat;
    VkImageType              imageType;
    VkImageViewType          viewType;
    VkImageCreateFlags       createFlags = 0;
    VkImageFormatProperties  imageFormatProperties;
    VkResult                 vResult;
    VkCommandBufferBeginInfo cmdBufBeginInfo = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
        .pNext = NULL
    };
    VkImageCreateInfo        imageCreateInfo = {
         .sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
         .pNext = NULL
    };
    VkMemoryAllocateInfo     memAllocInfo = {
        .sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
        .pNext = NULL,
        .allocationSize = 0,
        .memoryTypeIndex = 0
    };
    VkMemoryRequirements     memReqs;
    ktx_uint32_t             numImageLayers, numImageLevels;
    ktx_uint32_t elementSize = ktxTexture_GetElementSize(This);
    ktx_bool_t               canUseFasterPath;
    ktx_bool_t               useSuballocator = false;
    if (subAllocatorCallbacks) {
        if (subAllocatorCallbacks->allocMemFuncPtr &&
            subAllocatorCallbacks->bindBufferFuncPtr &&
            subAllocatorCallbacks->bindImageFuncPtr &&
            subAllocatorCallbacks->memoryMapFuncPtr &&
            subAllocatorCallbacks->memoryUnmapFuncPtr &&
            subAllocatorCallbacks->freeMemFuncPtr)
            useSuballocator = true;
        else
            return KTX_INVALID_VALUE;
    }

    if (!vdi || !This || !vkTexture) {
        return KTX_INVALID_VALUE;
    }

    if (!This->pData && !ktxTexture_isActiveStream(This)) {
        /* Nothing to upload. */
        return KTX_INVALID_OPERATION;
    }

    /* _ktxCheckHeader should have caught this. */
    assert(This->numFaces == 6 ? This->numDimensions == 2 : VK_TRUE);

    numImageLayers = This->numLayers;
    if (This->isCubemap) {
        numImageLayers *= 6;
        createFlags = VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
    }

    assert(This->numDimensions >= 1 && This->numDimensions <= 3);
    switch (This->numDimensions) {
      case 1:
        imageType = VK_IMAGE_TYPE_1D;
        viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_1D_ARRAY : VK_IMAGE_VIEW_TYPE_1D;
        break;
      case 2:
      default: // To keep compilers happy.
        imageType = VK_IMAGE_TYPE_2D;
        if (This->isCubemap)
            viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_CUBE_ARRAY : VK_IMAGE_VIEW_TYPE_CUBE;
        else
            viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_2D_ARRAY : VK_IMAGE_VIEW_TYPE_2D;
        break;
      case 3:
        imageType = VK_IMAGE_TYPE_3D;
        /* 3D array textures not supported in Vulkan. Attempts to create or
         * load them should have been trapped long before this.
         */
        assert(!This->isArray);
        viewType = VK_IMAGE_VIEW_TYPE_3D;
        break;
    }

    vkFormat = ktxTexture_GetVkFormat(This);
    if (vkFormat == VK_FORMAT_UNDEFINED) {
        return KTX_INVALID_OPERATION;
    }

    /* Get device properties for the requested image format */
    if (tiling == VK_IMAGE_TILING_OPTIMAL) {
        // Ensure we can copy from staging buffer to image.
        usageFlags |= VK_IMAGE_USAGE_TRANSFER_DST_BIT;
    }
    if (This->generateMipmaps) {
        // Ensure we can blit between levels.
        usageFlags |= (VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT);
    }
    vResult = vdi->vkFuncs.vkGetPhysicalDeviceImageFormatProperties(vdi->physicalDevice,
                                                      vkFormat,
                                                      imageType,
                                                      tiling,
                                                      usageFlags,
                                                      createFlags,
                                                      &imageFormatProperties);
    if (vResult == VK_ERROR_FORMAT_NOT_SUPPORTED) {
        return KTX_INVALID_OPERATION;
    }
    if (This->numLayers > imageFormatProperties.maxArrayLayers) {
        return KTX_INVALID_OPERATION;
    }

    if (This->generateMipmaps) {
        uint32_t max_dim;
        VkFormatProperties    formatProperties;
        VkFormatFeatureFlags  formatFeatureFlags;
        VkFormatFeatureFlags  neededFeatures
            = VK_FORMAT_FEATURE_BLIT_DST_BIT | VK_FORMAT_FEATURE_BLIT_SRC_BIT;
        vdi->vkFuncs.vkGetPhysicalDeviceFormatProperties(vdi->physicalDevice,
                                            vkFormat,
                                            &formatProperties);
        assert(vResult == VK_SUCCESS);
        if (tiling == VK_IMAGE_TILING_OPTIMAL)
            formatFeatureFlags = formatProperties.optimalTilingFeatures;
        else
            formatFeatureFlags = formatProperties.linearTilingFeatures;

        if ((formatFeatureFlags & neededFeatures) != neededFeatures)
            return KTX_INVALID_OPERATION;

        if (formatFeatureFlags & VK_FORMAT_FEATURE_SAMPLED_IMAGE_FILTER_LINEAR_BIT)
            blitFilter = VK_FILTER_LINEAR;
        else
            blitFilter = VK_FILTER_NEAREST; // XXX INVALID_OP?

        max_dim = MAX(MAX(This->baseWidth, This->baseHeight), This->baseDepth);
        numImageLevels = (uint32_t)floor(log2(max_dim)) + 1;
    } else {
        numImageLevels = This->numLevels;
    }

    if (numImageLevels > imageFormatProperties.maxMipLevels) {
        return KTX_INVALID_OPERATION;
    }

    if (This->classId == ktxTexture2_c) {
        canUseFasterPath = KTX_TRUE;
    } else {
        ktx_uint32_t actualRowPitch = ktxTexture_GetRowPitch(This, 0);
        ktx_uint32_t tightRowPitch = elementSize * This->baseWidth;
        // If the texture's images do not have any row padding, we can use a
        // faster path. Only uncompressed textures might have padding.
        //
        // The first test in the if will match compressed textures, because
        // they all have a block size that is a multiple of 4, as well as
        // a class of uncompressed textures that will never need padding.
        //
        // The second test matches textures whose level 0 has no padding. Any
        // texture whose block size is not a multiple of 4 will need padding
        // at some miplevel even if level 0 does not. So, if more than 1 level
        // exists, we must use the slower path.
        //
        // Note all elementSizes > 4 Will be a multiple of 4, so only
        // elementSizes of 1, 2 & 3 are a concern here.
        if (elementSize % 4 == 0  /* There'll be no padding at any level. */
               /* There is no padding at level 0 and no other levels. */
            || (This->numLevels == 1 && actualRowPitch == tightRowPitch))
            canUseFasterPath = KTX_TRUE;
        else
            canUseFasterPath = KTX_FALSE;
    }

    vkTexture->width = This->baseWidth;
    vkTexture->height = This->baseHeight;
    vkTexture->depth = This->baseDepth;
    vkTexture->imageLayout = finalLayout;
    vkTexture->imageFormat = vkFormat;
    vkTexture->levelCount = numImageLevels;
    vkTexture->layerCount = numImageLayers;
    vkTexture->viewType = viewType;
    vkTexture->vkDestroyImage = vdi->vkFuncs.vkDestroyImage;
    vkTexture->vkFreeMemory = vdi->vkFuncs.vkFreeMemory;

    VK_CHECK_RESULT(
            vdi->vkFuncs.vkBeginCommandBuffer(vdi->cmdBuffer, &cmdBufBeginInfo)
            );

    if (tiling == VK_IMAGE_TILING_OPTIMAL)
    {
        // Create a host-visible staging buffer that contains the raw image data
        VkBuffer stagingBuffer;
        VkDeviceMemory stagingMemory = VK_NULL_HANDLE;
        VkBufferImageCopy* copyRegions;
        VkDeviceSize textureSize;
        VkBufferCreateInfo bufferCreateInfo = {
          .sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
          .pNext = NULL
        };
        VkImageSubresourceRange subresourceRange;
        VkFence copyFence;
        VkFenceCreateInfo fenceCreateInfo = {
            .sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,
            .pNext = NULL,
            .flags = VK_FLAGS_NONE
        };
        VkSubmitInfo submitInfo = {
            .sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
            .pNext = NULL
        };
        ktx_uint8_t* pMappedStagingBuffer;
        ktx_uint32_t numCopyRegions;
        user_cbdata_optimal cbData;


        textureSize = ktxTexture_GetDataSizeUncompressed(This);
        bufferCreateInfo.size = textureSize;
        if (canUseFasterPath) {
            /*
             * Because all array layers and faces are the same size they can
             * be copied in a single operation so there'll be 1 copy per mip
             * level.
             */
            numCopyRegions = This->numLevels;
        } else {
            /*
             * Have to copy all images individually into the staging
             * buffer so we can place them at correct multiples of
             * elementSize and 4 and also need a copy region per image
             * in case they end up with padding between them.
             */
            numCopyRegions = This->isArray ? This->numLevels
                                  : This->numLevels * This->numFaces;
            /*
             * Add extra space to allow for possible padding described
             * above. A bit ad-hoc but it's only a small amount of
             * memory.
             */
            bufferCreateInfo.size += numCopyRegions * elementSize * 4;
        }
        copyRegions = (VkBufferImageCopy*)malloc(sizeof(VkBufferImageCopy)
                                                   * numCopyRegions);
        if (copyRegions == NULL) {
            return KTX_OUT_OF_MEMORY;
        }

        // This buffer is used as a transfer source for the buffer copy
        bufferCreateInfo.usage = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;
        bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateBuffer(vdi->device, &bufferCreateInfo,
                                       vdi->pAllocator, &stagingBuffer));

        // Get memory requirements for the staging buffer (alignment,
        // memory type bits)
        vdi->vkFuncs.vkGetBufferMemoryRequirements(vdi->device, stagingBuffer, &memReqs);

        memAllocInfo.allocationSize = memReqs.size;
        // Get memory type index for a host visible buffer
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
                vdi,
                memReqs.memoryTypeBits,
                VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT
              | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT
        );

        uint64_t stagingAllocId = 0ull;
        if (!useSuballocator) {
            vResult = vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo,
                vdi->pAllocator, &stagingMemory);
            if (vResult != VK_SUCCESS) {
                free(copyRegions);
                return KTX_OUT_OF_MEMORY;
            }
            VK_CHECK_RESULT(
                    vdi->vkFuncs.vkBindBufferMemory(vdi->device, stagingBuffer,
                        stagingMemory, 0));

            VK_CHECK_RESULT(
                    vdi->vkFuncs.vkMapMemory(vdi->device, stagingMemory, 0,
                        memReqs.size, 0,
                        (void**)&pMappedStagingBuffer));
        }
        else {
            uint64_t numPages = 0ull;
            stagingAllocId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (stagingAllocId == 0ull) {
                free(copyRegions);
                return KTX_OUT_OF_MEMORY;
            }
            if (numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                free(copyRegions);
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindBufferFuncPtr(stagingBuffer, stagingAllocId));
            VK_CHECK_RESULT(
                subAllocatorCallbacks->memoryMapFuncPtr(stagingAllocId, 0ull, 
                &memReqs.size,
                (void**)&pMappedStagingBuffer));
        }

        cbData.offset = 0;
        cbData.region = copyRegions;
        cbData.numFaces = This->numFaces;
        cbData.numLayers = This->numLayers;
        cbData.dest = pMappedStagingBuffer;
        cbData.elementSize = elementSize;
        cbData.numDimensions = This->numDimensions;
#if defined(_DEBUG)
        cbData.regionsArrayEnd = copyRegions + numCopyRegions;
#endif
        if (canUseFasterPath) {
            // Bulk load the data to the staging buffer and iterate
            // over levels.

            if (This->pData) {
                // Image data has already been loaded. Copy to staging
                // buffer.
                assert(This->dataSize <= memAllocInfo.allocationSize);
                memcpy(pMappedStagingBuffer, This->pData, This->dataSize);
            } else {
                /* Load the image data directly into the staging buffer. */
                /* The strange cast quiets an Xcode warning when building
                 * for the Generic iOS Device where size_t is 32-bit even
                 * when building for arm64. */
                kResult = ktxTexture_LoadImageData(This,
                                      pMappedStagingBuffer,
                                      (ktx_size_t)memAllocInfo.allocationSize);
                if (kResult != KTX_SUCCESS)
                    return kResult;
            }

            // Iterate over mip levels to set up the copy regions.
            kResult = ktxTexture_IterateLevels(This,
                                               optimalTilingCallback,
                                               &cbData);
            // XXX Check for possible errors.
        } else {
            // Iterate over face-levels with callback that copies the
            // face-levels to Vulkan-valid offsets in the staging buffer while
            // removing padding. Using face-levels minimizes pre-staging-buffer
            // buffering, in the event the data is not already loaded.
            if (This->pData) {
                kResult = ktxTexture_IterateLevelFaces(
                                            This,
                                            optimalTilingPadCallback,
                                            &cbData);
            } else {
                kResult = ktxTexture_IterateLoadLevelFaces(
                                            This,
                                            optimalTilingPadCallback,
                                            &cbData);
                // XXX Check for possible errors.
            }
        }

        if (!useSuballocator)
            vdi->vkFuncs.vkUnmapMemory(vdi->device, stagingMemory);
        else
            subAllocatorCallbacks->memoryUnmapFuncPtr(stagingAllocId, 0ull);

        // Create optimal tiled target image
        imageCreateInfo.imageType = imageType;
        imageCreateInfo.flags = createFlags;
        imageCreateInfo.format = vkFormat;
        // numImageLevels ensures enough levels for generateMipmaps.
        imageCreateInfo.mipLevels = numImageLevels;
        imageCreateInfo.arrayLayers = numImageLayers;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
        imageCreateInfo.usage = usageFlags;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        imageCreateInfo.extent.width = vkTexture->width;
        imageCreateInfo.extent.height = vkTexture->height;
        imageCreateInfo.extent.depth = vkTexture->depth;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateImage(vdi->device, &imageCreateInfo,
                                      vdi->pAllocator, &vkTexture->image));

        vdi->vkFuncs.vkGetImageMemoryRequirements(vdi->device, vkTexture->image, &memReqs);

        memAllocInfo.allocationSize = memReqs.size;
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
            vdi, memReqs.memoryTypeBits,
            VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

        if (!useSuballocator) {
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo,
                    vdi->pAllocator,
                    &vkTexture->deviceMemory));
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkBindImageMemory(vdi->device, vkTexture->image,
                    vkTexture->deviceMemory, 0));
        }
        else {
            uint64_t numPages = 0ull;
            vkTexture->allocationId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (vkTexture->allocationId == 0ull) {
                return KTX_OUT_OF_MEMORY;
            }
            if(numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindImageFuncPtr(vkTexture->image, vkTexture->allocationId));
        }

        subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.levelCount = This->numLevels;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.layerCount = numImageLayers;

        // Image barrier to transition, possibly only the base level, image
        // layout to TRANSFER_DST_OPTIMAL so it can be used as the copy
        // destination.
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_UNDEFINED,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            subresourceRange);

        // Copy mip levels from staging buffer
        vdi->vkFuncs.vkCmdCopyBufferToImage(
            vdi->cmdBuffer, stagingBuffer,
            vkTexture->image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            numCopyRegions, copyRegions
            );

        free(copyRegions);

        if (This->generateMipmaps) {
            generateMipmaps(vkTexture, vdi,
                            blitFilter, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
        } else {
            // Transition image layout to finalLayout after all mip levels
            // have been copied.
            // In this case numImageLevels == This->numLevels
            //subresourceRange.levelCount = numImageLevels;
            setImageLayout(
                vdi->vkFuncs,
                vdi->cmdBuffer,
                vkTexture->image,
                VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                finalLayout,
                subresourceRange);
        }

        // Submit command buffer containing copy and image layout commands
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkEndCommandBuffer(vdi->cmdBuffer));

        // Create a fence to make sure that the copies have finished before
        // continuing
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateFence(vdi->device, &fenceCreateInfo,
                                      vdi->pAllocator, &copyFence));

        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = &vdi->cmdBuffer;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkQueueSubmit(vdi->queue, 1, &submitInfo, copyFence));

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkWaitForFences(vdi->device, 1, &copyFence,
                                        VK_TRUE, DEFAULT_FENCE_TIMEOUT));

        vdi->vkFuncs.vkDestroyFence(vdi->device, copyFence, vdi->pAllocator);

        // Clean up staging resources
        if (!useSuballocator)
            vdi->vkFuncs.vkFreeMemory(vdi->device, stagingMemory, vdi->pAllocator);
        else
            subAllocatorCallbacks->freeMemFuncPtr(stagingAllocId);
        vdi->vkFuncs.vkDestroyBuffer(vdi->device, stagingBuffer, vdi->pAllocator);
    }
    else
    {
        VkImage mappableImage;
        VkDeviceMemory mappableMemory = VK_NULL_HANDLE;
        VkFence nullFence = { VK_NULL_HANDLE };
        VkSubmitInfo submitInfo = {
            .sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
            .pNext = NULL
        };
        user_cbdata_linear cbData;
        PFNKTXITERCB callback;

        imageCreateInfo.imageType = imageType;
        imageCreateInfo.flags = createFlags;
        imageCreateInfo.format = vkFormat;
        imageCreateInfo.extent.width = vkTexture->width;
        imageCreateInfo.extent.height = vkTexture->height;
        imageCreateInfo.extent.depth = vkTexture->depth;
        // numImageLevels ensures enough levels for generateMipmaps.
        imageCreateInfo.mipLevels = numImageLevels;
        imageCreateInfo.arrayLayers = numImageLayers;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_LINEAR;
        imageCreateInfo.usage = usageFlags;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;

        // Load mip map level 0 to linear tiling image
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateImage(vdi->device, &imageCreateInfo,
                                      vdi->pAllocator, &mappableImage));

        // Get memory requirements for this image
        // like size and alignment
        vdi->vkFuncs.vkGetImageMemoryRequirements(vdi->device, mappableImage, &memReqs);
        // Set memory allocation size to required memory size
        memAllocInfo.allocationSize = memReqs.size;

        // Get memory type that can be mapped to host memory
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
                vdi,
                memReqs.memoryTypeBits,
                VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);

        // Allocate host memory
        if (!useSuballocator) {
            vResult = vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo, vdi->pAllocator,
                &mappableMemory);
            if (vResult != VK_SUCCESS) {
                return KTX_OUT_OF_MEMORY;
            }
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkBindImageMemory(vdi->device, mappableImage,
                    mappableMemory, 0));
        }
        else {
            uint64_t numPages = 0ull;
            vkTexture->allocationId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (vkTexture->allocationId == 0ull) {
                return KTX_OUT_OF_MEMORY;
            }
            if (numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindImageFuncPtr(mappableImage, vkTexture->allocationId));
        }

        cbData.vkFuncs = vdi->vkFuncs;
        cbData.destImage = mappableImage;
        cbData.device = vdi->device;
        cbData.texture = This;
        callback = canUseFasterPath ?
                         linearTilingCallback : linearTilingPadCallback;

        // Map image memory
        if (!useSuballocator) {
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkMapMemory(vdi->device, mappableMemory, 0,
                    memReqs.size, 0, (void**)&cbData.dest));
        }
        else {
            VK_CHECK_RESULT(
                subAllocatorCallbacks->memoryMapFuncPtr(vkTexture->allocationId, 0ull,
                    &memReqs.size, (void**)&cbData.dest));
        }

        // Iterate over images to copy texture data into mapped image memory.
        if (ktxTexture_isActiveStream(This)) {
            kResult = ktxTexture_IterateLoadLevelFaces(This,
                                                       callback,
                                                       &cbData);
        } else {
            kResult = ktxTexture_IterateLevelFaces(This,
                                                   callback,
                                                   &cbData);
        }
        // XXX Check for possible errors
        if (!useSuballocator)
            vdi->vkFuncs.vkUnmapMemory(vdi->device, mappableMemory);
        else
            subAllocatorCallbacks->memoryUnmapFuncPtr(vkTexture->allocationId, 0ull);

        // Linear tiled images can be directly used as textures.
        vkTexture->image = mappableImage;
        if (!useSuballocator) vkTexture->deviceMemory = mappableMemory;

        if (This->generateMipmaps) {
            generateMipmaps(vkTexture, vdi,
                            blitFilter,
                            VK_IMAGE_LAYOUT_PREINITIALIZED);
        } else {
            VkImageSubresourceRange subresourceRange;
            subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
            subresourceRange.baseMipLevel = 0;
            subresourceRange.levelCount = numImageLevels;
            subresourceRange.baseArrayLayer = 0;
            subresourceRange.layerCount = numImageLayers;

           // Transition image layout to finalLayout.
            setImageLayout(
                vdi->vkFuncs,
                vdi->cmdBuffer,
                vkTexture->image,
                VK_IMAGE_LAYOUT_PREINITIALIZED,
                finalLayout,
                subresourceRange);
        }

        // Submit command buffer containing image layout commands
        VK_CHECK_RESULT(vdi->vkFuncs.vkEndCommandBuffer(vdi->cmdBuffer));

        submitInfo.waitSemaphoreCount = 0;
        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = &vdi->cmdBuffer;

        VK_CHECK_RESULT(vdi->vkFuncs.vkQueueSubmit(vdi->queue, 1, &submitInfo, nullFence));
        VK_CHECK_RESULT(vdi->vkFuncs.vkQueueWaitIdle(vdi->queue));
    }
    return KTX_SUCCESS;
}